

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QList<QByteArray> * __thiscall QMetaMethodBuilder::parameterTypes(QMetaMethodBuilder *this)

{
  QMetaMethodBuilderPrivate *this_00;
  QList<QByteArray> *in_RDI;
  QMetaMethodBuilderPrivate *d;
  QMetaMethodBuilder *in_stack_ffffffffffffffe8;
  
  this_00 = d_func(in_stack_ffffffffffffffe8);
  if (this_00 == (QMetaMethodBuilderPrivate *)0x0) {
    memset(in_RDI,0,0x18);
    QList<QByteArray>::QList((QList<QByteArray> *)0x378d3e);
  }
  else {
    QMetaMethodBuilderPrivate::parameterTypes(this_00);
  }
  return in_RDI;
}

Assistant:

QList<QByteArray> QMetaMethodBuilder::parameterTypes() const
{
    QMetaMethodBuilderPrivate *d = d_func();
    if (d)
        return d->parameterTypes();
    else
        return QList<QByteArray>();
}